

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O0

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,assign_statement_t *stmt)

{
  long lVar1;
  integer_variables_t *piVar2;
  clock_variables_t *pcVar3;
  expression_type_t eVar4;
  expression_type_t rtype;
  lvalue_expression_t *plVar5;
  expression_t *expr;
  element_type *peVar6;
  element_type *peVar7;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined4 local_104;
  shared_ptr<tchecker::typed_assign_statement_t> local_100;
  shared_ptr<tchecker::typed_sum_to_clock_assign_statement_t> local_f0;
  shared_ptr<const_tchecker::typed_expression_t> local_e0;
  shared_ptr<tchecker::typed_clock_to_clock_assign_statement_t> local_d0;
  shared_ptr<tchecker::typed_int_to_clock_assign_statement_t> local_c0;
  undefined1 local_ac [8];
  statement_type_t stmt_type;
  shared_ptr<tchecker::typed_expression_t> local_88;
  undefined1 local_78 [8];
  shared_ptr<const_tchecker::typed_expression_t> typed_rvalue;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_58;
  shared_ptr<tchecker::typed_expression_t> local_38;
  undefined1 local_28 [8];
  shared_ptr<const_tchecker::typed_lvalue_expression_t> typed_lvalue;
  assign_statement_t *stmt_local;
  statement_typechecker_t *this_local;
  
  typed_lvalue.
  super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stmt;
  plVar5 = assign_statement_t::lvalue(stmt);
  lVar1 = *(long *)((long)*plVar5 + -0x38);
  piVar2 = this->_intvars;
  pcVar3 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_58,&this->_error);
  typecheck((tchecker *)&local_38,(expression_t *)(&plVar5->field_0x0 + lVar1),&this->_localvars,
            piVar2,pcVar3,&local_58);
  std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t_const,tchecker::typed_expression_t>
            ((shared_ptr<tchecker::typed_expression_t> *)local_28);
  std::shared_ptr<tchecker::typed_expression_t>::~shared_ptr(&local_38);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_58);
  expr = assign_statement_t::rvalue
                   ((assign_statement_t *)
                    typed_lvalue.
                    super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
  piVar2 = this->_intvars;
  pcVar3 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(local_ac + 4),&this->_error);
  typecheck((tchecker *)&local_88,expr,&this->_localvars,piVar2,pcVar3,
            (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)(local_ac + 4));
  std::shared_ptr<tchecker::typed_expression_t_const>::shared_ptr<tchecker::typed_expression_t,void>
            ((shared_ptr<tchecker::typed_expression_t_const> *)local_78,&local_88);
  std::shared_ptr<tchecker::typed_expression_t>::~shared_ptr(&local_88);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)(local_ac + 4));
  peVar6 = std::
           __shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  eVar4 = typed_expression_t::type(&peVar6->super_typed_expression_t);
  peVar7 = std::
           __shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_78);
  rtype = typed_expression_t::type(peVar7);
  local_ac._0_4_ = type_assign(eVar4,rtype);
  if (local_ac._0_4_ == STMT_TYPE_CLKASSIGN_INT) {
    std::
    make_shared<tchecker::typed_int_to_clock_assign_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
              ((statement_type_t *)&local_c0,
               (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_ac,
               (shared_ptr<const_tchecker::typed_expression_t> *)local_28);
    std::shared_ptr<tchecker::typed_statement_t>::operator=(&this->_typed_stmt,&local_c0);
    std::shared_ptr<tchecker::typed_int_to_clock_assign_statement_t>::~shared_ptr(&local_c0);
  }
  else if (local_ac._0_4_ == STMT_TYPE_CLKASSIGN_CLK) {
    std::
    dynamic_pointer_cast<tchecker::typed_lvalue_expression_t_const,tchecker::typed_expression_t_const>
              (&local_e0);
    std::
    make_shared<tchecker::typed_clock_to_clock_assign_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>>
              ((statement_type_t *)&local_d0,
               (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_ac,
               (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_28);
    std::shared_ptr<tchecker::typed_statement_t>::operator=(&this->_typed_stmt,&local_d0);
    std::shared_ptr<tchecker::typed_clock_to_clock_assign_statement_t>::~shared_ptr(&local_d0);
    std::shared_ptr<const_tchecker::typed_lvalue_expression_t>::~shared_ptr
              ((shared_ptr<const_tchecker::typed_lvalue_expression_t> *)&local_e0);
  }
  else if (local_ac._0_4_ == STMT_TYPE_CLKASSIGN_SUM) {
    std::
    make_shared<tchecker::typed_sum_to_clock_assign_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
              ((statement_type_t *)&local_f0,
               (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_ac,
               (shared_ptr<const_tchecker::typed_expression_t> *)local_28);
    std::shared_ptr<tchecker::typed_statement_t>::operator=(&this->_typed_stmt,&local_f0);
    std::shared_ptr<tchecker::typed_sum_to_clock_assign_statement_t>::~shared_ptr(&local_f0);
  }
  else {
    std::
    make_shared<tchecker::typed_assign_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
              ((statement_type_t *)&local_100,
               (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_ac,
               (shared_ptr<const_tchecker::typed_expression_t> *)local_28);
    std::shared_ptr<tchecker::typed_statement_t>::operator=(&this->_typed_stmt,&local_100);
    std::shared_ptr<tchecker::typed_assign_statement_t>::~shared_ptr(&local_100);
  }
  if (local_ac._0_4_ == STMT_TYPE_BAD) {
    peVar6 = std::
             __shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    eVar4 = typed_expression_t::type(&peVar6->super_typed_expression_t);
    if (eVar4 != EXPR_TYPE_BAD) {
      peVar7 = std::
               __shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_78);
      eVar4 = typed_expression_t::type(peVar7);
      if (eVar4 != EXPR_TYPE_BAD) {
        statement_t::to_string_abi_cxx11_
                  (&local_168,
                   (statement_t *)
                   ((long)&(typed_lvalue.
                            super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                   (long)(typed_lvalue.
                          super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_vptr__Sp_counted_base[-7]));
        std::operator+(&local_148,"in statement ",&local_168);
        std::operator+(&local_128,&local_148,", invalid assignement");
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&this->_error,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
      }
    }
    local_104 = 0;
  }
  else {
    local_104 = 1;
  }
  std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_expression_t> *)local_78);
  std::shared_ptr<const_tchecker::typed_lvalue_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_28);
  return;
}

Assistant:

virtual void visit(tchecker::assign_statement_t const & stmt)
  {
    // Left and right values
    auto typed_lvalue = std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t const>(
        tchecker::typecheck(stmt.lvalue(), _localvars, _intvars, _clocks, _error));

    std::shared_ptr<tchecker::typed_expression_t const> typed_rvalue =
        tchecker::typecheck(stmt.rvalue(), _localvars, _intvars, _clocks, _error);

    // Typed statement
    enum tchecker::statement_type_t stmt_type = type_assign(typed_lvalue->type(), typed_rvalue->type());

    switch (stmt_type) {
    case STMT_TYPE_CLKASSIGN_INT:
      _typed_stmt = std::make_shared<tchecker::typed_int_to_clock_assign_statement_t>(stmt_type, typed_lvalue, typed_rvalue);
      break;
    case STMT_TYPE_CLKASSIGN_CLK:
      _typed_stmt = std::make_shared<tchecker::typed_clock_to_clock_assign_statement_t>(
          stmt_type, typed_lvalue, std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t const>(typed_rvalue));
      break;
    case STMT_TYPE_CLKASSIGN_SUM:
      _typed_stmt = std::make_shared<tchecker::typed_sum_to_clock_assign_statement_t>(stmt_type, typed_lvalue, typed_rvalue);
      break;
    default: // either STMT_TYPE_INTASSIGN or STMT_TYPE_BAD
      _typed_stmt = std::make_shared<tchecker::typed_assign_statement_t>(stmt_type, typed_lvalue, typed_rvalue);
      break;
    }

    // Report bad type
    if (stmt_type != tchecker::STMT_TYPE_BAD)
      return;

    if ((typed_lvalue->type() != tchecker::EXPR_TYPE_BAD) && (typed_rvalue->type() != tchecker::EXPR_TYPE_BAD))
      _error("in statement " + stmt.to_string() + ", invalid assignement");
  }